

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
* toml::detail::parse_impl<toml::type_config>
            (result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
             *__return_storage_ptr__,vector<unsigned_char,_std::allocator<unsigned_char>_> *cs,
            string *fname,spec *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar uVar2;
  pointer puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar4;
  basic_value<toml::type_config> *v;
  basic_value<toml::type_config> *ctx_00;
  ulong uVar5;
  location *this;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  context<toml::type_config> ctx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2d0 [8];
  undefined1 local_2c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0 [2];
  undefined8 local_290;
  region local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c8;
  ulong local_1b8;
  size_t sStack_1b0;
  size_t local_1a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_198;
  region local_158;
  basic_value<toml::type_config> local_f0;
  
  puVar3 = (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start == puVar3) {
    local_1e8._8_8_ = operator_new(0x28);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00576508;
    local_1e8._0_8_ = local_1e8._8_8_ + 0x10;
    puVar3 = (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 0x10))->
    _vptr__Sp_counted_base =
         (_func_int **)
         (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 0x10))->_M_use_count =
         puVar3;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e8._8_8_ + 0x20))->
    _vptr__Sp_counted_base =
         (_func_int **)
         (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(fname->_M_dataplus)._M_p;
    paVar1 = &fname->field_2;
    if (local_2f0 == paVar1) {
      local_2e0._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_2e0._8_8_ = *(undefined8 *)((long)&fname->field_2 + 8);
      local_2f0 = &local_2e0;
    }
    else {
      local_2e0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_1e8._24_8_ = fname->_M_string_length;
    (fname->_M_dataplus)._M_p = (pointer)paVar1;
    fname->_M_string_length = 0;
    (fname->field_2)._M_local_buf[0] = '\0';
    local_1e8._16_8_ = &aStack_1c8;
    if (local_2f0 == &local_2e0) {
      aStack_1c8._8_8_ = local_2e0._8_8_;
    }
    else {
      local_1e8._16_8_ = local_2f0;
    }
    aStack_1c8._M_allocated_capacity = local_2e0._M_allocated_capacity;
    local_2e8 = 0;
    local_2e0._M_allocated_capacity = local_2e0._M_allocated_capacity & 0xffffffffffffff00;
    local_1b8 = 0;
    sStack_1b0 = 1;
    local_1a8 = 1;
    local_198._M_buckets = &local_198._M_single_bucket;
    local_198._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_198._M_element_count = 0;
    local_198._M_bucket_count = 1;
    local_198._M_rehash_policy._M_max_load_factor = 1.0;
    local_198._M_rehash_policy._4_4_ = 0;
    local_198._M_rehash_policy._M_next_resize = 0;
    local_198._M_single_bucket = (__node_base_ptr)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f0 = &local_2e0;
    region::region(&local_158,(location *)local_1e8);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_2d0,(table_type *)&local_198,
               (table_format_info)ZEXT816(0),&local_208,&local_158);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_f0,(toml *)local_2d0,v);
    __return_storage_ptr__->is_ok_ = true;
    ctx_00 = &local_f0;
    basic_value<toml::type_config>::basic_value
              (&(__return_storage_ptr__->field_1).succ_.value,&local_f0);
    basic_value<toml::type_config>::cleanup(&local_f0,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_f0.comments_);
    region::~region(&local_f0.region_);
    basic_value<toml::type_config>::cleanup
              ((basic_value<toml::type_config> *)local_2d0,(EVP_PKEY_CTX *)ctx_00);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&vStack_220);
    region::~region(&local_288);
    region::~region(&local_158);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_208);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_198);
    this = (location *)local_1e8;
  }
  else {
    uVar2 = puVar3[-1];
    if ((uVar2 != '\n') && (uVar2 != '\r')) {
      local_2d0[0] = 10;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (cs,local_2d0);
    }
    local_2c8._0_8_ = operator_new(0x28);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._0_8_)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00576508;
    local_2d0 = (undefined1  [8])(local_2c8._0_8_ + 0x10);
    puVar3 = (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2c8._0_8_ + 0x10))->
    _vptr__Sp_counted_base =
         (_func_int **)
         (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2c8._0_8_ + 0x10))->_M_use_count =
         puVar3;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2c8._0_8_ + 0x20))->
    _vptr__Sp_counted_base =
         (_func_int **)
         (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (cs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_310 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(fname->_M_dataplus)._M_p;
    paVar1 = &fname->field_2;
    if (local_310 == paVar1) {
      local_300._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_300._8_8_ = *(undefined8 *)((long)&fname->field_2 + 8);
      local_310 = &local_300;
    }
    else {
      local_300._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_2c8._16_8_ = fname->_M_string_length;
    (fname->_M_dataplus)._M_p = (pointer)paVar1;
    fname->_M_string_length = 0;
    (fname->field_2)._M_local_buf[0] = '\0';
    local_2c8._8_8_ = local_2b0;
    if (local_310 == &local_300) {
      local_2b0[0]._8_8_ = local_300._8_8_;
    }
    else {
      local_2c8._8_8_ = local_310;
    }
    local_2b0[0]._M_allocated_capacity = local_300._M_allocated_capacity;
    local_300._M_allocated_capacity = local_300._M_allocated_capacity & 0xffffffffffffff00;
    local_2b0[1]._0_8_ = 0;
    local_2b0[1]._8_8_ = 1;
    local_290 = 1;
    if (2 < (ulong)(*(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                              (local_2c8._0_8_ + 0x10))->_M_use_count -
                   (long)(((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0)->
                           _vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data._M_start)) {
      location::location((location *)local_1e8,(location *)local_2d0);
      puVar3 = (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2d0)->_M_impl)
               .super__Vector_impl_data._M_start;
      uVar4 = (long)*(pointer *)((long)local_2d0 + 8) - (long)puVar3;
      if ((ulong)local_2b0[1]._0_8_ < uVar4) {
        bVar8 = puVar3[local_2b0[1]._0_8_] == 0xef;
      }
      else {
        bVar8 = false;
      }
      uVar5 = local_2b0[1]._0_8_ + 1;
      uVar7 = local_2b0[1]._8_8_;
      if (uVar5 < uVar4) {
        if (puVar3[local_2b0[1]._0_8_] == '\n') {
          local_2b0[1]._8_8_ = local_2b0[1]._8_8_ + 1;
          local_290 = 1;
        }
        else {
          local_290 = local_290 + 1;
        }
      }
      else {
        for (; uVar5 = uVar4, uVar4 != local_2b0[1]._0_8_;
            local_2b0[1]._0_8_ = local_2b0[1]._0_8_ + 1) {
          if (puVar3[local_2b0[1]._0_8_] == '\n') {
            uVar7 = uVar7 + 1;
            local_290 = 1;
            local_2b0[1]._8_8_ = uVar7;
          }
          else {
            local_290 = local_290 + 1;
          }
        }
      }
      if (uVar5 < uVar4) {
        bVar9 = puVar3[uVar5] == 0xbb;
      }
      else {
        bVar9 = false;
      }
      uVar6 = uVar5 + 1;
      uVar7 = local_2b0[1]._8_8_;
      if (uVar6 < uVar4) {
        if (puVar3[uVar5] == '\n') {
          local_2b0[1]._8_8_ = local_2b0[1]._8_8_ + 1;
          local_290 = 1;
        }
        else {
          local_290 = local_290 + 1;
        }
      }
      else {
        for (; uVar6 = uVar4, uVar4 != uVar5; uVar5 = uVar5 + 1) {
          if (puVar3[uVar5] == '\n') {
            uVar7 = uVar7 + 1;
            local_290 = 1;
            local_2b0[1]._8_8_ = uVar7;
          }
          else {
            local_290 = local_290 + 1;
          }
        }
      }
      if (uVar6 < uVar4) {
        bVar10 = puVar3[uVar6] == 0xbf;
      }
      else {
        bVar10 = false;
      }
      local_2b0[1]._0_8_ = uVar6 + 1;
      uVar7 = local_2b0[1]._8_8_;
      if ((ulong)local_2b0[1]._0_8_ < uVar4) {
        if (puVar3[uVar6] == '\n') {
          local_2b0[1]._8_8_ = local_2b0[1]._8_8_ + 1;
          local_290 = 1;
        }
        else {
          local_290 = local_290 + 1;
        }
      }
      else {
        for (; local_2b0[1]._0_8_ = uVar4, uVar4 != uVar6; uVar6 = uVar6 + 1) {
          if (puVar3[uVar6] == '\n') {
            uVar7 = uVar7 + 1;
            local_290 = 1;
            local_2b0[1]._8_8_ = uVar7;
          }
          else {
            local_290 = local_290 + 1;
          }
        }
      }
      if (!(bool)(bVar8 & bVar9 & bVar10)) {
        local_2d0 = (undefined1  [8])local_1e8._0_8_;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_2c8,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2c8 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_1e8 + 0x10));
        local_290 = local_1a8;
        local_2b0[1]._0_8_ = local_1b8;
        local_2b0[1]._8_8_ = sStack_1b0;
      }
      location::~location((location *)local_1e8);
    }
    local_1e8._16_8_ = *(undefined8 *)&s->v1_1_0_add_escape_sequence_e;
    local_1e8._0_8_ = *(undefined8 *)&s->version;
    local_1e8._8_8_ = *(undefined8 *)&(s->version).patch;
    local_1e8._24_8_ = (pointer)0x0;
    aStack_1c8._M_allocated_capacity = 0;
    aStack_1c8._8_8_ = 0;
    parse_file<toml::type_config>
              (__return_storage_ptr__,(location *)local_2d0,(context<toml::type_config> *)local_1e8)
    ;
    std::vector<toml::error_info,_std::allocator<toml::error_info>_>::~vector
              ((vector<toml::error_info,_std::allocator<toml::error_info>_> *)(local_1e8 + 0x18));
    this = (location *)local_2d0;
  }
  location::~location(this);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, std::vector<error_info>>
parse_impl(std::vector<location::char_type> cs, std::string fname, const spec& s)
{
    using value_type = basic_value<TC>;
    using table_type = typename value_type::table_type;

    // an empty file is a valid toml file.
    if(cs.empty())
    {
        auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));
        location loc(std::move(src), std::move(fname));
        return ok(value_type(table_type(), table_format_info{}, std::vector<std::string>{}, region(loc)));
    }

    // to simplify parser, add newline at the end if there is no LF.
    // But, if it has raw CR, the file is invalid (in TOML, CR is not a valid
    // newline char). if it ends with CR, do not add LF and report it.
    if(cs.back() != '\n' && cs.back() != '\r')
    {
        cs.push_back('\n');
    }

    auto src = std::make_shared<std::vector<location::char_type>>(std::move(cs));

    location loc(std::move(src), std::move(fname));

    // skip BOM if found
    if(loc.source()->size() >= 3)
    {
        auto first = loc;

        const auto c0 = loc.current(); loc.advance();
        const auto c1 = loc.current(); loc.advance();
        const auto c2 = loc.current(); loc.advance();

        const auto bom_found = (c0 == 0xEF) && (c1 == 0xBB) && (c2 == 0xBF);
        if( ! bom_found)
        {
            loc = first;
        }
    }

    context<TC> ctx(s);

    return parse_file(loc, ctx);
}